

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase *
Catch::makeTestCase(ITestCase *_testCase,string *_className,string *_name,string *_descOrTags,
                   SourceLineInfo *_lineInfo)

{
  byte bVar1;
  SourceLineInfo *pSVar2;
  char *pcVar3;
  string *in_RCX;
  TestCase *in_RDI;
  ulong in_R8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  TestCaseInfo info;
  SpecialProperties prop;
  char c;
  size_t i;
  bool inTag;
  string tag;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  bool isHidden;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  TestCaseInfo *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  SourceLineInfo *in_stack_fffffffffffffd28;
  allocator *paVar5;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  string *in_stack_fffffffffffffd38;
  SourceLineInfo *_lineInfo_00;
  undefined7 in_stack_fffffffffffffd50;
  TestCase *_className_00;
  TestCaseInfo *this;
  undefined1 local_161 [33];
  _Base_ptr local_140;
  undefined1 local_138;
  allocator local_129;
  string local_128 [32];
  _Base_ptr local_108;
  undefined1 local_100;
  SpecialProperties local_f8;
  char local_f1;
  SourceLineInfo *local_f0;
  byte local_e1;
  string local_e0 [32];
  string local_c0 [103];
  undefined1 local_59 [40];
  byte local_31;
  ulong local_28;
  
  this = (TestCaseInfo *)local_59;
  _className_00 = in_RDI;
  local_28 = in_R8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_59 + 1),"./",(allocator *)this);
  bVar1 = startsWith(in_stack_fffffffffffffd38,
                     (string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  local_31 = bVar1 & 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x17abda);
  std::__cxx11::string::string(local_c0);
  std::__cxx11::string::string(local_e0);
  local_e1 = 0;
  local_f0 = (SourceLineInfo *)0x0;
  while (_lineInfo_00 = local_f0, pSVar2 = (SourceLineInfo *)std::__cxx11::string::size(),
        _lineInfo_00 < pSVar2) {
    pcVar3 = (char *)std::__cxx11::string::operator[](local_28);
    local_f1 = *pcVar3;
    if ((local_e1 & 1) == 0) {
      if (local_f1 == '[') {
        local_e1 = 1;
      }
      else {
        std::__cxx11::string::operator+=(local_c0,local_f1);
      }
    }
    else if (local_f1 == ']') {
      local_f8 = parseSpecialTag(&_lineInfo_00->file);
      if (local_f8 == IsHidden) {
        local_31 = 1;
      }
      else if (local_f8 == None) {
        enforceNotReservedTag
                  ((string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28);
      }
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffd20._M_node,
                       (value_type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      local_108 = (_Base_ptr)pVar4.first._M_node;
      in_stack_fffffffffffffd37 = pVar4.second;
      local_100 = in_stack_fffffffffffffd37;
      std::__cxx11::string::clear();
      local_e1 = 0;
    }
    else {
      std::__cxx11::string::operator+=(local_e0,local_f1);
    }
    local_f0 = (SourceLineInfo *)&local_f0->field_0x1;
  }
  if ((local_31 & 1) != 0) {
    paVar5 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"hide",paVar5);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd20._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
    in_stack_fffffffffffffd20 = pVar4.first._M_node;
    in_stack_fffffffffffffd1f = pVar4.second;
    local_140 = in_stack_fffffffffffffd20._M_node;
    local_138 = in_stack_fffffffffffffd1f;
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    in_stack_fffffffffffffd10 = (TestCaseInfo *)local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_161 + 1),".",(allocator *)in_stack_fffffffffffffd10);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffd20._M_node,
                     (value_type *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
    in_stack_fffffffffffffd07 = pVar4.second;
    std::__cxx11::string::~string((string *)(local_161 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_161);
  }
  TestCaseInfo::TestCaseInfo
            (this,in_RCX,(string *)_className_00,(string *)in_RDI,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(bVar1,in_stack_fffffffffffffd50),_lineInfo_00);
  TestCase::TestCase((TestCase *)in_stack_fffffffffffffd20._M_node,
                     (ITestCase *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10);
  TestCaseInfo::~TestCaseInfo
            ((TestCaseInfo *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x17b00d);
  return _className_00;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden( startsWith( _name, "./" ) ); // Legacy support

        // Parse out tags
        std::set<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for( std::size_t i = 0; i < _descOrTags.size(); ++i ) {
            char c = _descOrTags[i];
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( prop == TestCaseInfo::IsHidden )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    tags.insert( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.insert( "hide" );
            tags.insert( "." );
        }

        TestCaseInfo info( _name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, info );
    }